

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O2

void testing::internal::PrintWideCharsAsStringTo(wchar_t *begin,size_t len,ostream *os)

{
  wchar_t c;
  bool bVar1;
  CharFormat CVar2;
  size_t index;
  size_t sVar3;
  
  std::operator<<(os,"L\"");
  bVar1 = false;
  for (sVar3 = 0; len != sVar3; sVar3 = sVar3 + 1) {
    c = begin[sVar3];
    if ((bool)(bVar1 & (uint)c < 0x80)) {
      bVar1 = IsXDigit((char)c);
      if (bVar1) {
        std::operator<<(os,"\" L\"");
      }
    }
    CVar2 = PrintAsWideStringLiteralTo(c,os);
    bVar1 = CVar2 == kHexEscape;
  }
  std::operator<<(os,"\"");
  return;
}

Assistant:

static void PrintWideCharsAsStringTo(const wchar_t* begin, size_t len,
                                     ostream* os) {
  *os << "L\"";
  bool is_previous_hex = false;
  for (size_t index = 0; index < len; ++index) {
    const wchar_t cur = begin[index];
    if (is_previous_hex && isascii(cur) && IsXDigit(static_cast<char>(cur))) {
      // Previous character is of '\x..' form and this character can be
      // interpreted as another hexadecimal digit in its number. Break string to
      // disambiguate.
      *os << "\" L\"";
    }
    is_previous_hex = PrintAsWideStringLiteralTo(cur, os) == kHexEscape;
  }
  *os << "\"";
}